

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool trans_BXNS(DisasContext_conflict1 *s,arg_BXNS *a)

{
  int reg;
  TCGContext_conflict1 *s_00;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  TCGTemp *ts;
  TCGContext_conflict1 *tcg_ctx;
  TCGTemp *local_38;
  TCGTemp *local_30;
  
  if (s->v8m_secure != false) {
    reg = a->rm;
    s_00 = s->uc->tcg_ctx;
    ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    load_reg_var(s,(TCGv_i32)((long)ts - (long)s_00),reg);
    local_38 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
    local_30 = ts;
    tcg_gen_callN_aarch64(s_00,helper_v7m_bxns_aarch64,(TCGTemp *)0x0,2,&local_38);
    tcg_temp_free_internal_aarch64(s_00,ts);
    (s->base).is_jmp = DISAS_TARGET_9;
    return (_Bool)extraout_AL;
  }
  unallocated_encoding_aarch64(s);
  return (_Bool)extraout_AL_00;
}

Assistant:

static bool trans_BXNS(DisasContext *s, arg_BXNS *a)
{
    if (!s->v8m_secure || IS_USER_ONLY) {
        unallocated_encoding(s);
    } else {
        gen_bxns(s, a->rm);
    }
    return true;
}